

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp_comparison.cpp
# Opt level: O1

void duckdb::ExpressionIsConstant(Expression *expr,bool *is_constant)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  if ((expr->super_BaseExpression).type == BOUND_COLUMN_REF) {
    *is_constant = false;
  }
  else {
    local_28._8_8_ = 0;
    pcStack_10 = ::std::
                 _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/rule/timestamp_comparison.cpp:50:46)>
                 ::_M_invoke;
    local_18 = ::std::
               _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/optimizer/rule/timestamp_comparison.cpp:50:46)>
               ::_M_manager;
    local_28._M_unused._0_8_ = (undefined8)is_constant;
    ExpressionIterator::EnumerateChildren(expr,(function<void_(duckdb::Expression_&)> *)&local_28);
    if (local_18 != (code *)0x0) {
      (*local_18)(&local_28,&local_28,__destroy_functor);
    }
  }
  return;
}

Assistant:

static void ExpressionIsConstant(Expression &expr, bool &is_constant) {
	if (expr.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		is_constant = false;
		return;
	}
	ExpressionIterator::EnumerateChildren(expr, [&](Expression &child) { ExpressionIsConstant(child, is_constant); });
}